

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mrg5s.cc
# Opt level: O3

void __thiscall trng::mrg5s::mrg5s(mrg5s *this,unsigned_long s,parameter_type *P)

{
  int iVar1;
  undefined8 uVar2;
  int iVar3;
  
  (this->P).a[4] = P->a[4];
  uVar2 = *(undefined8 *)(P->a + 2);
  *(undefined8 *)(this->P).a = *(undefined8 *)P->a;
  *(undefined8 *)((this->P).a + 2) = uVar2;
  (this->S).r[1] = 1;
  (this->S).r[2] = 1;
  (this->S).r[3] = 1;
  (this->S).r[4] = 1;
  iVar1 = (int)((long)s % 0x7fffa78f);
  iVar3 = iVar1 + 0x7fffa78f;
  if (-1 < (long)s % 0x7fffa78f) {
    iVar3 = iVar1;
  }
  (this->S).r[0] = iVar3;
  return;
}

Assistant:

mrg5s::mrg5s(unsigned long s, const mrg5s::parameter_type &P) : P{P} { seed(s); }